

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.c
# Opt level: O2

sysbvm_tuple_t
sysbvm_astUnexpandedSExpressionNode_primitiveAnalyze
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  ulong array;
  sysbvm_tuple_t sVar1;
  sysbvm_tuple_t *psVar2;
  sysbvm_stackFrameSourcePositionRecord_t sourcePositionRecord;
  sysbvm_tuple_t local_68 [6];
  sysbvm_stackFrameRecord_t local_38;
  undefined8 local_28;
  sysbvm_tuple_t *local_20;
  
  if (argumentCount != 2) {
    sysbvm_error_argumentCountMismatch(2,argumentCount);
  }
  local_20 = local_68;
  local_68[2] = 0;
  local_68[3] = 0;
  local_68[0] = 0;
  local_68[1] = 0;
  local_68[4] = 0;
  local_38.previous = (sysbvm_stackFrameRecord_s *)0x0;
  local_38.type = SYSBVM_STACK_FRAME_RECORD_TYPE_GC_ROOTS;
  local_38._12_4_ = 0;
  local_28 = 5;
  sysbvm_stackFrame_pushRecord(&local_38);
  sourcePositionRecord.previous = (sysbvm_stackFrameRecord_t *)0x0;
  sourcePositionRecord.type = SYSBVM_STACK_FRAME_RECORD_TYPE_SOURCE_POSITION;
  sourcePositionRecord.sourcePosition = *(sysbvm_tuple_t *)(*arguments + 0x10);
  sysbvm_stackFrame_pushRecord((sysbvm_stackFrameRecord_t *)&sourcePositionRecord);
  array = *(ulong *)(*arguments + 0x28);
  if (((array & 0xf) == 0 && array != 0) && (7 < *(uint *)(array + 0xc))) {
    psVar2 = local_68 + 4;
    local_68[2] = *(sysbvm_tuple_t *)(array + 0x10);
    local_68[3] = sysbvm_array_fromOffset(context,array,1);
    sVar1 = sysbvm_astUnexpandedApplicationNode_create
                      (context,*(sysbvm_tuple_t *)(*arguments + 0x10),local_68[2],local_68[3]);
  }
  else {
    psVar2 = local_68 + 1;
    local_68[0] = sysbvm_array_create(context,0);
    sVar1 = sysbvm_astLiteralNode_create(context,*(sysbvm_tuple_t *)(*arguments + 0x10),local_68[0])
    ;
  }
  *psVar2 = sVar1;
  sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t *)&sourcePositionRecord);
  sysbvm_stackFrame_popRecord(&local_38);
  sVar1 = sysbvm_interpreter_analyzeASTWithCurrentExpectedTypeWithEnvironment
                    (context,*psVar2,arguments[1]);
  return sVar1;
}

Assistant:

static sysbvm_tuple_t sysbvm_astUnexpandedSExpressionNode_primitiveAnalyze(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)context;
    (void)closure;
    if(argumentCount != 2) sysbvm_error_argumentCountMismatch(2, argumentCount);

    sysbvm_tuple_t *node = &arguments[0];
    sysbvm_tuple_t *environment = &arguments[1];

    sysbvm_astUnexpandedSExpressionNode_t **unexpandedSExpressionNode = (sysbvm_astUnexpandedSExpressionNode_t**)node;

    struct {
        sysbvm_tuple_t array;
        sysbvm_tuple_t literalNode;
        sysbvm_tuple_t functionOrMacroExpression;
        sysbvm_tuple_t argumentExpressions;
        sysbvm_tuple_t unexpandedApplicationNode;
    } gcFrame = {0};
    SYSBVM_STACKFRAME_PUSH_GC_ROOTS(gcFrameRecord, gcFrame);
    SYSBVM_STACKFRAME_PUSH_SOURCE_POSITION(sourcePositionRecord, (*unexpandedSExpressionNode)->super.sourcePosition);

    size_t elementCount = sysbvm_array_getSize((*unexpandedSExpressionNode)->elements);
    if(elementCount == 0)
    {
        // Empty array.
        gcFrame.array = sysbvm_array_create(context, 0);
        gcFrame.literalNode = sysbvm_astLiteralNode_create(context, (*unexpandedSExpressionNode)->super.sourcePosition, gcFrame.array);
        SYSBVM_STACKFRAME_POP_SOURCE_POSITION(sourcePositionRecord);
        SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
        return sysbvm_interpreter_analyzeASTWithCurrentExpectedTypeWithEnvironment(context, gcFrame.literalNode, *environment);
    }
    else
    {
        // Unexpanded application node.
        gcFrame.functionOrMacroExpression = sysbvm_array_at((*unexpandedSExpressionNode)->elements, 0);
        gcFrame.argumentExpressions = sysbvm_array_fromOffset(context, (*unexpandedSExpressionNode)->elements, 1);
        gcFrame.unexpandedApplicationNode = sysbvm_astUnexpandedApplicationNode_create(context, (*unexpandedSExpressionNode)->super.sourcePosition, gcFrame.functionOrMacroExpression, gcFrame.argumentExpressions);
        SYSBVM_STACKFRAME_POP_SOURCE_POSITION(sourcePositionRecord);
        SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
        return sysbvm_interpreter_analyzeASTWithCurrentExpectedTypeWithEnvironment(context, gcFrame.unexpandedApplicationNode, *environment);
    }
}